

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

int archeck(int p,double *ar)

{
  int iVar1;
  double *coeff;
  double *ZEROR;
  double *ZEROI;
  void *__ptr;
  ulong uVar2;
  int iVar3;
  undefined4 uVar4;
  long lVar5;
  double dVar6;
  
  lVar5 = (long)p;
  coeff = (double *)malloc(lVar5 * 8 + 8);
  ZEROR = (double *)malloc(lVar5 * 8);
  ZEROI = (double *)malloc(lVar5 * 8);
  __ptr = malloc(lVar5 * 4 + 4);
  *coeff = 1.0;
  if (0 < p) {
    uVar2 = 0;
    do {
      coeff[uVar2 + 1] = -ar[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)p != uVar2);
  }
  if (-1 < p) {
    uVar2 = 0;
    do {
      uVar4 = 0xffffffff;
      if (coeff[uVar2] != 0.0) {
        uVar4 = (int)uVar2;
      }
      if (NAN(coeff[uVar2])) {
        uVar4 = (int)uVar2;
      }
      *(undefined4 *)((long)__ptr + uVar2 * 4) = uVar4;
      uVar2 = uVar2 + 1;
    } while (p + 1 != uVar2);
  }
  if (-1 < p) {
    iVar3 = -1;
    uVar2 = 0;
    do {
      iVar1 = *(int *)((long)__ptr + uVar2 * 4);
      if (iVar1 < iVar3) {
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      uVar2 = uVar2 + 1;
    } while (p + 1 != uVar2);
    if (iVar3 == 0) goto LAB_00131fdf;
  }
  polyroot(coeff,p,ZEROR,ZEROI);
  if (0 < p) {
    uVar2 = 0;
    do {
      dVar6 = ZEROI[uVar2] * ZEROI[uVar2] + ZEROR[uVar2] * ZEROR[uVar2];
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      if (dVar6 < 1.0) {
        iVar3 = 0;
        goto LAB_00131fea;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)p != uVar2);
  }
LAB_00131fdf:
  iVar3 = 1;
LAB_00131fea:
  free(coeff);
  free(ZEROR);
  free(ZEROI);
  free(__ptr);
  return iVar3;
}

Assistant:

int archeck(int p, double *ar) {
	int check, N, i;
	double *coeff,*zeror,*zeroi,mod,wmaxv;
	int *which,wmax;

	N = p + 1;
	check = 1;

	coeff = (double*)malloc(sizeof(double)*N);
	zeror = (double*)malloc(sizeof(double)*p);
	zeroi = (double*)malloc(sizeof(double)*p);
	which = (int*)malloc(sizeof(int)*N);

	coeff[0] = 1.0;

	for(i = 0; i < p;++i) {
		coeff[i+1] = -ar[i];
	}

	for(i = 0; i < N;++i) {
		if (coeff[i] != 0) {
			which[i] = i;
		} else {
			which[i] = -1;
		}
	}

	wmax = -1;

	for(i = 0; i < N;++i) {
		if (wmax < which[i]) {
			wmax = which[i];
		}
	}

	if (!wmax){
		free(coeff);
		free(zeror);
		free(zeroi);
		free(which);
		return 1;
	}

	//polyroot(double *coeff, int DEGREE, double *ZEROR, double *ZEROI)

	polyroot(coeff,p,zeror,zeroi);

	for(i = 0; i < p;++i) {
		mod = sqrt(pow(zeror[i],2.0) + pow(zeroi[i],2));
		if (mod < 1.0) {
			free(coeff);
			free(zeror);
			free(zeroi);
			free(which);
			return 0;
		}
	}


	free(coeff);
	free(zeror);
	free(zeroi);
	free(which);
	return check;
}